

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall
DnsStats::SubmitPacket
          (DnsStats *this,uint8_t *packet,uint32_t length,int ip_type,uint8_t *ip_header,
          my_bpftimeval ts)

{
  size_t local_48;
  size_t dest_addr_length;
  uint8_t *dest_addr;
  size_t source_addr_length;
  uint8_t *source_addr;
  uint8_t *ip_header_local;
  int ip_type_local;
  uint32_t length_local;
  uint8_t *packet_local;
  DnsStats *this_local;
  
  source_addr = ip_header;
  ip_header_local._0_4_ = ip_type;
  ip_header_local._4_4_ = length;
  _ip_type_local = packet;
  packet_local = (uint8_t *)this;
  GetSourceAddress(ip_type,ip_header,(uint8_t **)&source_addr_length,(size_t *)&dest_addr);
  GetDestAddress((int)ip_header_local,source_addr,(uint8_t **)&dest_addr_length,&local_48);
  SubmitPacket(this,_ip_type_local,ip_header_local._4_4_,(uint8_t *)source_addr_length,
               (size_t)dest_addr,(uint8_t *)dest_addr_length,local_48,ts);
  return;
}

Assistant:

void DnsStats::SubmitPacket(uint8_t * packet, uint32_t length, int ip_type, uint8_t* ip_header,
    my_bpftimeval ts)
{
    uint8_t * source_addr;
    size_t source_addr_length;
    uint8_t * dest_addr;
    size_t dest_addr_length;

    GetSourceAddress(ip_type, ip_header, &source_addr, &source_addr_length);
    GetDestAddress(ip_type, ip_header, &dest_addr, &dest_addr_length);

    SubmitPacket(packet, length, source_addr, source_addr_length,
        dest_addr, dest_addr_length, ts);
}